

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

PolymorphicInlineCacheInfo * __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::EnsureInlineeInfo
          (EntryPointPolymorphicInlineCacheInfo *this,Recycler *recycler,
          FunctionBody *inlineeFunctionBody)

{
  FunctionBody *this_00;
  Recycler *alloc;
  PolymorphicInlineCacheInfo *this_01;
  TrackAllocData local_50;
  PolymorphicInlineCacheInfo *local_28;
  PolymorphicInlineCacheInfo *info;
  FunctionBody *inlineeFunctionBody_local;
  Recycler *recycler_local;
  EntryPointPolymorphicInlineCacheInfo *this_local;
  
  info = (PolymorphicInlineCacheInfo *)inlineeFunctionBody;
  inlineeFunctionBody_local = (FunctionBody *)recycler;
  recycler_local = (Recycler *)this;
  local_28 = GetInlineeInfo(this,inlineeFunctionBody);
  this_00 = inlineeFunctionBody_local;
  if (local_28 == (PolymorphicInlineCacheInfo *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&PolymorphicInlineCacheInfo::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x1fc4);
    alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this_00,&local_50);
    this_01 = (PolymorphicInlineCacheInfo *)new<Memory::Recycler>(0x20,alloc,0x43c4b0);
    PolymorphicInlineCacheInfo::PolymorphicInlineCacheInfo(this_01,(FunctionBody *)info);
    local_28 = this_01;
    SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Prepend
              (&(this->inlineeInfo).
                super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>,&local_28
              );
  }
  return local_28;
}

Assistant:

PolymorphicInlineCacheInfo * EntryPointPolymorphicInlineCacheInfo::EnsureInlineeInfo(Recycler * recycler, FunctionBody * inlineeFunctionBody)
    {
        PolymorphicInlineCacheInfo * info = GetInlineeInfo(inlineeFunctionBody);
        if (!info)
        {
            info = RecyclerNew(recycler, PolymorphicInlineCacheInfo, inlineeFunctionBody);
            inlineeInfo.Prepend(info);
        }
        return info;
    }